

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall QIconModeViewBase::updateContentsSize(QIconModeViewBase *this)

{
  QSize QVar1;
  long lVar2;
  int i;
  ulong uVar3;
  long in_FS_OFFSET;
  QRect local_58;
  QRect local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.x1.m_i = 0;
  local_48.y1.m_i = 0;
  local_48.x2.m_i = -1;
  local_48.y2.m_i = -1;
  lVar2 = 0;
  for (uVar3 = 0; uVar3 < (ulong)(this->items).d.size; uVar3 = uVar3 + 1) {
    local_58 = QListViewItem::rect((QListViewItem *)((long)&((this->items).d.ptr)->x + lVar2));
    QRect::operator|=(&local_48,&local_58);
    lVar2 = lVar2 + 0x14;
  }
  QVar1.wd.m_i = (local_48.x2.m_i - local_48.x1.m_i) + 1;
  QVar1.ht.m_i = (local_48.y2.m_i - local_48.y1.m_i) + 1;
  (this->super_QCommonListViewBase).contentsSize = QVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIconModeViewBase::updateContentsSize()
{
    QRect bounding;
    for (int i = 0; i < items.size(); ++i)
        bounding |= items.at(i).rect();
    contentsSize = bounding.size();
}